

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzSubW2(word *a,size_t n,word w)

{
  size_t i;
  word w_local;
  size_t n_local;
  word *a_local;
  
  w_local = w;
  for (i = 0; i < n; i = i + 1) {
    a[i] = a[i] - w_local;
    w_local = (word)(int)(uint)((w_local ^ 0xffffffffffffffff) < a[i]);
  }
  return w_local;
}

Assistant:

word zzSubW2(word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
#ifndef SAFE_FAST
	for (i = 0; i < n; ++i)
		a[i] -= w, w = wordLess01(~w, a[i]);
#else
	for (i = 0; w && i < n; ++i)
		a[i] -= w, w = a[i] > (word)~w;
#endif
	return w;
}